

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_meta.cc
# Opt level: O0

void __thiscall SelectiveBranchingMT::task_data::task_data(task_data *this,size_t mb,size_t kb)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  v_init<std::pair<float,v_array<std::pair<unsigned_int,float>>>>();
  in_RDI[2] = local_38;
  in_RDI[3] = local_30;
  in_RDI[4] = local_28;
  in_RDI[5] = local_20;
  v_init<std::pair<std::pair<float,v_array<std::pair<unsigned_int,float>>>,std::__cxx11::string*>>()
  ;
  in_RDI[6] = local_58;
  in_RDI[7] = local_50;
  in_RDI[8] = local_48;
  in_RDI[9] = local_40;
  v_init<std::pair<unsigned_int,float>>();
  in_RDI[10] = local_78;
  in_RDI[0xb] = local_70;
  in_RDI[0xc] = local_68;
  in_RDI[0xd] = local_60;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  return;
}

Assistant:

task_data(size_t mb, size_t kb) : max_branches(mb), kbest(kb)
  {
    branches = v_init<branch>();
    final = v_init<pair<branch, string*> >();
    trajectory = v_init<act_score>();
    output_string = nullptr;
    kbest_out = nullptr;
  }